

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O2

void ncnn::conv3x3s1_winograd63_transform_kernel(Mat *kernel,Mat *AT,int inch,int outch,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  void *pvVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int *piVar7;
  int iVar8;
  ulong uVar9;
  uint max_ii;
  ulong uVar10;
  int _c;
  _func_int ***ppp_Var11;
  uint max_kk;
  int kk;
  _func_int ***ppp_Var12;
  ulong uVar13;
  float *pfVar14;
  long lVar15;
  int m_1;
  long lVar16;
  int iVar17;
  ulong uVar18;
  float z7;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int TILE_K;
  int TILE_N;
  int TILE_M;
  Mat local_128;
  ulong uStack_e0;
  undefined1 local_d8 [12];
  float fStack_cc;
  size_t local_c8;
  float local_c0 [2];
  undefined8 local_b8;
  int local_b0;
  int local_ac;
  float local_a8 [4];
  size_t local_98;
  float afStack_90 [6];
  Mat m;
  
  get_optimal_tile_mnk(outch,0,inch,&TILE_M,&TILE_N,&TILE_K,opt->num_threads);
  _c = (outch + TILE_M + -1) / TILE_M;
  local_128.cstep = 0;
  local_128.data = (Allocator *)0x0;
  local_128.refcount._0_4_ = 0;
  local_128.refcount._4_4_ = 0;
  local_128.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_128.elempack = 0;
  local_128.h = 0;
  local_128.allocator = (Allocator *)local_128.data;
  local_128.dims = (int)local_128.refcount;
  local_128.w = local_128.refcount._4_4_;
  local_128.d = (int)local_128.refcount;
  local_128.c = local_128.elempack;
  Mat::create(&local_128,TILE_K * TILE_M * 0x40,1,opt->num_threads,4,(Allocator *)0x0);
  Mat::create(AT,TILE_K * TILE_M,0x40,(inch + TILE_K + -1) / TILE_K,_c,4,(Allocator *)0x0);
  if (_c < 1) {
    _c = 0;
  }
  for (iVar17 = 0; iVar17 != _c; iVar17 = iVar17 + 1) {
    iVar8 = get_omp_thread_num();
    ppp_Var12 = (_func_int ***)
                ((long)(_func_int ***)local_128.data +
                (long)iVar8 * local_128.cstep * local_128.elemsize);
    m.data = ppp_Var12;
    m.refcount = (int *)0x0;
    m.elemsize = local_128.elemsize;
    m.elempack = local_128.elempack;
    m.allocator = local_128.allocator;
    m.w = local_128.w;
    m.h = local_128.h;
    m.d = 1;
    m.c = local_128.d;
    m.cstep = (local_128.elemsize * (long)local_128.h * (long)local_128.w + 0xf & 0xfffffffffffffff0
              ) / local_128.elemsize;
    m.dims = local_128.dims + -1;
    if (local_128.dims == 4) {
      m.cstep = (long)local_128.h * (long)local_128.w;
    }
    max_ii = outch - TILE_M * iVar17;
    if (TILE_M < (int)max_ii) {
      max_ii = TILE_M;
    }
    iVar8 = 0;
    uVar18 = 0;
    if (0 < (int)max_ii) {
      uVar18 = (ulong)max_ii;
    }
    for (; max_kk = inch - iVar8, max_kk != 0 && iVar8 <= inch; iVar8 = iVar8 + TILE_K) {
      if (TILE_K < (int)max_kk) {
        max_kk = TILE_K;
      }
      uVar9 = 0;
      if (0 < (int)max_kk) {
        uVar9 = (ulong)max_kk;
      }
      ppp_Var11 = ppp_Var12;
      for (uVar10 = 0; uVar10 != uVar18; uVar10 = uVar10 + 1) {
        pvVar4 = kernel->data;
        for (uVar13 = 0; uVar13 != uVar9; uVar13 = uVar13 + 1) {
          pfVar14 = (float *)((long)pvVar4 +
                             (uVar13 + (long)iVar8) * 0x24 +
                             (long)(((int)uVar10 + TILE_M * iVar17) * inch * 9) * 4);
          for (lVar16 = 0; lVar15 = 8, lVar16 != 3; lVar16 = lVar16 + 1) {
            fVar1 = *pfVar14;
            fVar2 = pfVar14[1];
            fVar3 = pfVar14[2];
            *(float *)(local_d8 + lVar16 * 4) = fVar1;
            (&fStack_cc)[lVar16] = (fVar1 * -0.22222222 - fVar2 * 0.22222222) + fVar3 * -0.22222222;
            local_c0[lVar16] = fVar2 * 0.22222222 + fVar1 * -0.22222222 + fVar3 * -0.22222222;
            *(float *)((long)&local_b8 + lVar16 * 4 + 4) =
                 fVar2 * 0.022222223 + fVar1 * 0.011111111 + fVar3 * 0.044444446;
            local_a8[lVar16] = (fVar1 * 0.011111111 - fVar2 * 0.022222223) + fVar3 * 0.044444446;
            local_a8[lVar16 + 3] = fVar2 * 0.011111111 + fVar1 * 0.022222223 + fVar3 * 0.0055555557;
            afStack_90[lVar16] = (fVar1 * 0.022222223 - fVar2 * 0.011111111) + fVar3 * 0.0055555557;
            afStack_90[lVar16 + 3] = fVar3;
            pfVar14 = pfVar14 + 3;
          }
          for (; lVar15 != 0x68; lVar15 = lVar15 + 0xc) {
            fVar1 = *(float *)(local_d8 + lVar15);
            auVar20._8_8_ = 0;
            auVar20._0_8_ = *(ulong *)((long)&uStack_e0 + lVar15);
            auVar5 = vshufps_avx(auVar20,auVar20,0x14);
            auVar21._0_4_ = auVar5._0_4_ * -0.22222222;
            auVar21._4_4_ = auVar5._4_4_ * 0.22222222;
            auVar21._8_4_ = auVar5._8_4_ * 0.022222223;
            auVar21._12_4_ = auVar5._12_4_ * 0.011111111;
            auVar5 = vshufps_avx(auVar21,auVar21,0xa5);
            auVar6 = vsubps_avx(auVar21,auVar5);
            auVar5 = vhaddps_avx(auVar21,auVar21);
            auVar5 = vshufps_avx(auVar6,auVar5,0xcc);
            auVar6 = vshufps_avx(auVar5,auVar5,0x78);
            fVar19 = (float)*(ulong *)((long)&uStack_e0 + lVar15);
            fVar2 = fVar19 * 0.022222223;
            auVar5 = vmovshdup_avx(auVar20);
            fVar3 = auVar5._0_4_ * 0.011111111;
            *(float *)ppp_Var11 = fVar19;
            *(float *)((long)ppp_Var11 + 4) = auVar6._0_4_ + fVar1 * -0.22222222;
            *(float *)(ppp_Var11 + 1) = auVar6._4_4_ + fVar1 * -0.22222222;
            *(float *)((long)(ppp_Var11 + 1) + 4) = auVar6._8_4_ + fVar1 * 0.044444446;
            *(float *)(ppp_Var11 + 2) = auVar6._12_4_ + fVar1 * 0.044444446;
            *(float *)((long)(ppp_Var11 + 2) + 4) = fVar3 + fVar2 + fVar1 * 0.0055555557;
            *(float *)(ppp_Var11 + 3) = (fVar2 - fVar3) + fVar1 * 0.0055555557;
            *(float *)((long)(ppp_Var11 + 3) + 4) = fVar1;
            ppp_Var11 = ppp_Var11 + 4;
          }
        }
      }
      local_ac = AT->w;
      local_a8[0] = (float)AT->h;
      local_c8 = AT->elemsize;
      local_c0[0] = (float)AT->elempack;
      local_b8 = AT->allocator;
      local_98 = (long)(int)local_a8[0] * (long)local_ac;
      local_d8._0_8_ =
           (long)AT->data +
           local_c8 * local_98 * (long)(iVar8 / TILE_K) + AT->cstep * (long)iVar17 * local_c8;
      stack0xffffffffffffff30 = (int *)0x0;
      local_b0 = 2;
      local_a8[1] = 1.4013e-45;
      local_a8[2] = 1.4013e-45;
      pack_A_tile(&m,(Mat *)local_d8,0x40,max_ii,max_kk);
    }
  }
  piVar7 = (int *)CONCAT44(local_128.refcount._4_4_,(int)local_128.refcount);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_128.allocator == (Allocator *)0x0) {
        free(local_128.data);
      }
      else {
        (*(local_128.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_transform_kernel(const Mat& kernel, Mat& AT, int inch, int outch, const Option& opt)
{
    const int M = outch;
    const int K = inch;
    const int B = 64;

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, 0, K, TILE_M, TILE_N, TILE_K, opt.num_threads);

    const int nn_M = (M + TILE_M - 1) / TILE_M;

    Mat A_tileX(B * TILE_M * TILE_K, 1, opt.num_threads, 4u, (Allocator*)0);

    AT.create(TILE_K * TILE_M, B, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 4u, (Allocator*)0);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        Mat A_tile = A_tileX.channel(get_omp_thread_num());

        for (int k = 0; k < K; k += TILE_K)
        {
            const int max_ii = std::min((M - i), TILE_M);
            const int max_kk = std::min((K - k), TILE_K);

            conv3x3s1_winograd63_transform_kernel_tile(kernel, A_tile, inch, i, max_ii, k, max_kk);

            Mat AT_tile = AT.channel(i / TILE_M).depth(k / TILE_K);

            pack_A_tile(A_tile, AT_tile, B, max_ii, max_kk);
        }
    }
}